

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O2

sx_job_context * sx_job_create_context(sx_alloc *alloc,sx_job_context_desc *desc)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined1 *puVar4;
  int iVar5;
  uint32_t tid;
  sx_job_context *psVar6;
  sx_tls pvVar7;
  sx__job_thread_data *data;
  sx_fiber_t pvVar8;
  sx_pool *psVar9;
  uint32_t *__s;
  sx_thread **ppsVar10;
  size_t sVar11;
  sx_thread *psVar12;
  ulong uVar13;
  char *func;
  uint32_t line;
  void *user_data2;
  sx_fiber_stack stack;
  char name [32];
  
  func = (char *)0x0;
  line = 0;
  psVar6 = (sx_job_context *)
           (*alloc->alloc_cb)((void *)0x0,0x1c0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
  if (psVar6 == (sx_job_context *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",0x233);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x233,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar6 = (sx_job_context *)(*pcVar1)();
    return psVar6;
  }
  memset(psVar6,0,0x1c0);
  psVar6->alloc = alloc;
  iVar5 = desc->num_threads;
  if (iVar5 < 1) {
    iVar5 = sx_os_numcores();
    iVar5 = iVar5 + -1;
  }
  psVar6->num_threads = iVar5;
  pvVar7 = sx_tls_create();
  psVar6->thread_tls = pvVar7;
  iVar5 = 0x100000;
  if (0 < desc->fiber_stack_sz) {
    iVar5 = desc->fiber_stack_sz;
  }
  psVar6->stack_sz = iVar5;
  puVar4 = desc->thread_shutdown_cb;
  psVar6->thread_init_cb = desc->thread_init_cb;
  psVar6->thread_shutdown_cb = puVar4;
  psVar6->thread_user = desc->thread_user_data;
  uVar13 = 0x40;
  if (0 < desc->max_fibers) {
    uVar13 = (ulong)(uint)desc->max_fibers;
  }
  sx_semaphore_init(&psVar6->sem);
  tid = sx_thread_tid();
  data = sx__job_create_tdata(alloc,tid,0,true);
  if (data == (sx__job_thread_data *)0x0) {
    (*alloc->alloc_cb)(psVar6,0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
  }
  else {
    sx_tls_set(psVar6->thread_tls,data);
    uVar2 = (data->selector_stack).sptr;
    uVar3 = (data->selector_stack).ssize;
    stack.ssize = uVar3;
    stack.sptr = (void *)uVar2;
    stack._12_4_ = 0;
    pvVar8 = sx_fiber_create(stack,sx__job_selector_main_thrd);
    data->selector_fiber = pvVar8;
    psVar9 = sx__pool_create(alloc,0x78,(int)uVar13,(char *)0x24d,func,line);
    psVar6->job_pool = psVar9;
    psVar9 = sx__pool_create(alloc,4,0x100,(char *)0x24e,func,line);
    psVar6->counter_pool = psVar9;
    if (psVar9 != (sx_pool *)0x0 && psVar6->job_pool != (sx_pool *)0x0) {
      memset(psVar6->job_pool->pages->buff,0,uVar13 * 0x78);
      __s = (uint32_t *)
            (*alloc->alloc_cb)((void *)0x0,(long)psVar6->num_threads * 4 + 4,0,(char *)0x0,
                               (char *)0x0,0,alloc->user_data);
      psVar6->tags = __s;
      memset(__s,0xff,(long)psVar6->num_threads * 4 + 4);
      if ((long)psVar6->num_threads < 1) {
        return psVar6;
      }
      ppsVar10 = (sx_thread **)
                 (*alloc->alloc_cb)((void *)0x0,(long)psVar6->num_threads << 3,0,(char *)0x0,
                                    (char *)0x0,0,alloc->user_data);
      psVar6->threads = ppsVar10;
      if (ppsVar10 != (sx_thread **)0x0) {
        user_data2 = (void *)0x0;
        while( true ) {
          if ((long)psVar6->num_threads <= (long)user_data2) {
            return psVar6;
          }
          sx_snprintf(name,0x20,"sx_job_thread(%d)",(ulong)((int)user_data2 + 1));
          sVar11 = sx_os_minstacksz();
          psVar12 = sx_thread_create(alloc,sx__job_thread_fn,psVar6,(int)sVar11,name,user_data2);
          psVar6->threads[(long)user_data2] = psVar12;
          if (psVar6->threads[(long)user_data2] == (sx_thread *)0x0) break;
          user_data2 = (void *)((long)user_data2 + 1);
        }
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                          ,0x261,"sx_thread_create failed!");
        pcVar1 = (code *)swi(3);
        psVar6 = (sx_job_context *)(*pcVar1)();
        return psVar6;
      }
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                        0x25a,"ctx->threads");
      pcVar1 = (code *)swi(3);
      psVar6 = (sx_job_context *)(*pcVar1)();
      return psVar6;
    }
  }
  return (sx_job_context *)0x0;
}

Assistant:

sx_job_context* sx_job_create_context(const sx_alloc* alloc, const sx_job_context_desc* desc)
{
    sx_job_context* ctx = (sx_job_context*)sx_malloc(alloc, sizeof(sx_job_context));
    if (!ctx) {
        sx_out_of_memory();
        return NULL;
    }
    sx_memset(ctx, 0x0, sizeof(sx_job_context));

    ctx->alloc = alloc;
    ctx->num_threads = desc->num_threads > 0 ? desc->num_threads : (sx_os_numcores() - 1);
    ctx->thread_tls = sx_tls_create();
    ctx->stack_sz = desc->fiber_stack_sz > 0 ? desc->fiber_stack_sz : DEFAULT_FIBER_STACK_SIZE;
    ctx->thread_init_cb = desc->thread_init_cb;
    ctx->thread_shutdown_cb = desc->thread_shutdown_cb;
    ctx->thread_user = desc->thread_user_data;
    int max_fibers = desc->max_fibers > 0 ? desc->max_fibers : DEFAULT_MAX_FIBERS;

    sx_semaphore_init(&ctx->sem);

    sx__job_thread_data* main_tdata = sx__job_create_tdata(alloc, sx_thread_tid(), 0, true);
    if (!main_tdata) {
        sx_free(alloc, ctx);
        return NULL;
    }
    sx_tls_set(ctx->thread_tls, main_tdata);
    main_tdata->selector_fiber =
        sx_fiber_create(main_tdata->selector_stack, sx__job_selector_main_thrd);

    // pools
    ctx->job_pool = sx_pool_create(alloc, sizeof(sx__job), max_fibers);
    ctx->counter_pool = sx_pool_create(alloc, sizeof(int), COUNTER_POOL_SIZE);
    if (!ctx->job_pool || !ctx->counter_pool)
        return NULL;
    sx_memset(ctx->job_pool->pages->buff, 0x0, sizeof(sx__job) * max_fibers);

    // keep tags in an array for evaluating num_jobs
    ctx->tags = sx_malloc(alloc, sizeof(uint32_t) * ((size_t)ctx->num_threads + 1));
    sx_memset(ctx->tags, 0xff, sizeof(uint32_t) * ((size_t)ctx->num_threads + 1));

    // Worker threads
    if (ctx->num_threads > 0) {
        ctx->threads = (sx_thread**)sx_malloc(alloc, sizeof(sx_thread*) * ctx->num_threads);
        sx_assert(ctx->threads);

        for (int i = 0; i < ctx->num_threads; i++) {
            char name[32];
            sx_snprintf(name, sizeof(name), "sx_job_thread(%d)", i + 1);
            ctx->threads[i] = sx_thread_create(alloc, sx__job_thread_fn, ctx, (int)sx_os_minstacksz(),
                                               name, (void*)(intptr_t)i);
            sx_assertf(ctx->threads[i], "sx_thread_create failed!");
        }
    }

    return ctx;
}